

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O2

void __thiscall cppforth::Forth::requireRStackAvailable(Forth *this,size_t n,char *name)

{
  allocator<char> local_51;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  if ((ulong)((long)(this->rStack).stack.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(this->rStack).stack.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start >> 2) <= (this->rStack).top + n) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,name,&local_51);
    std::operator+(&local_50,&local_30,": return stack overflow");
    throwCppExceptionMessage(this,&local_50,errorRStackOverflow);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_30);
  }
  return;
}

Assistant:

bool availableStack(size_t n) {
				return	(top + n) < stack.size();
			}